

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManPrintDecs(FILE *pFile,If_DsdMan_t *p)

{
  uint uVar1;
  Vec_Mem_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  bool bVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  word *tLimit;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong *puVar25;
  uint uVar26;
  int *piVar27;
  int pDecMax [15];
  int pCountsSSizes [15];
  int pCountsAll [15];
  int pCounts [15] [18];
  uint local_528 [16];
  int local_4e8 [16];
  uint local_4a8 [16];
  int local_468 [17];
  int aiStack_424 [253];
  
  local_528[0xc] = 0;
  local_528[0xd] = 0;
  local_528[0xe] = 0;
  local_528[8] = 0;
  local_528[9] = 0;
  local_528[10] = 0;
  local_528[0xb] = 0;
  local_528[4] = 0;
  local_528[5] = 0;
  local_528[6] = 0;
  local_528[7] = 0;
  local_528[0] = 0;
  local_528[1] = 0;
  local_528[2] = 0;
  local_528[3] = 0;
  local_4a8[0xc] = 0;
  local_4a8[0xd] = 0;
  local_4a8[0xe] = 0;
  local_4a8[8] = 0;
  local_4a8[9] = 0;
  local_4a8[10] = 0;
  local_4a8[0xb] = 0;
  local_4a8[4] = 0;
  local_4a8[5] = 0;
  local_4a8[6] = 0;
  local_4a8[7] = 0;
  local_4a8[0] = 0;
  local_4a8[1] = 0;
  local_4a8[2] = 0;
  local_4a8[3] = 0;
  local_4e8[0xc] = 0;
  local_4e8[0xd] = 0;
  local_4e8[0xe] = 0;
  local_4e8[8] = 0;
  local_4e8[9] = 0;
  local_4e8[10] = 0;
  local_4e8[0xb] = 0;
  local_4e8[4] = 0;
  local_4e8[5] = 0;
  local_4e8[6] = 0;
  local_4e8[7] = 0;
  local_4e8[0] = 0;
  local_4e8[1] = 0;
  local_4e8[2] = 0;
  local_4e8[3] = 0;
  memset(local_468,0,0x438);
  uVar13 = p->nVars;
  uVar14 = (ulong)uVar13;
  if (2 < (int)uVar13) {
    iVar7 = uVar13 - 6;
    uVar10 = 1 << ((byte)iVar7 & 0x1f);
    uVar16 = 1;
    if (1 < (int)uVar10) {
      uVar16 = (ulong)uVar10;
    }
    lVar11 = 3;
    do {
      pVVar2 = p->vTtMem[lVar11];
      pVVar3 = p->vTtDecs[lVar11];
      uVar26 = pVVar2->nEntries;
      uVar9 = (ulong)uVar26;
      uVar1 = pVVar3->nSize;
      if (uVar26 != uVar1) {
        __assert_fail("Vec_MemEntryNum(p->vTtMem[v]) == Vec_PtrSize(p->vTtDecs[v])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                      ,0x215,"void If_DsdManPrintDecs(FILE *, If_DsdMan_t *)");
      }
      if (0 < (int)uVar1) {
        ppvVar4 = pVVar3->pArray;
        uVar19 = 0;
        if (0 < (int)uVar26) {
          uVar19 = uVar9;
        }
        uVar18 = 0;
LAB_0038c626:
        if (uVar18 != uVar19) {
          puVar22 = pVVar2->ppPages[(uint)uVar18 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                    (int)((pVVar2->PageMask & (uint)uVar18) * pVVar2->nEntrySize);
          uVar12 = 0;
          uVar21 = 0;
LAB_0038c681:
          if ((int)uVar13 < 7) {
            uVar15 = (uint)((s_Truths6Neg[uVar12] &
                            (*puVar22 >> ((byte)(1 << ((byte)uVar12 & 0x1f)) & 0x3f) ^ *puVar22)) !=
                           0);
          }
          else {
            uVar15 = 0;
            if (uVar12 < 6) {
              if (iVar7 != 0x1f) {
                uVar24 = 0;
                do {
                  if (((puVar22[uVar24] >> ((byte)(1 << ((byte)uVar12 & 0x1f)) & 0x3f) ^
                       puVar22[uVar24]) & s_Truths6Neg[uVar12]) != 0) goto LAB_0038c753;
                  uVar24 = uVar24 + 1;
                  uVar15 = 0;
                } while (uVar16 != uVar24);
              }
            }
            else if (iVar7 != 0x1f) {
              bVar8 = (byte)(uVar12 - 6);
              uVar15 = 1 << (bVar8 & 0x1f);
              iVar17 = 2 << (bVar8 & 0x1f);
              uVar24 = 1;
              if (1 < (int)uVar15) {
                uVar24 = (ulong)uVar15;
              }
              puVar23 = puVar22 + (int)uVar15;
              puVar25 = puVar22;
              do {
                if (uVar12 - 6 != 0x1f) {
                  uVar20 = 0;
                  do {
                    if (puVar25[uVar20] != puVar23[uVar20]) goto LAB_0038c753;
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                puVar25 = puVar25 + iVar17;
                puVar23 = puVar23 + iVar17;
                uVar15 = 0;
              } while (puVar25 < puVar22 + (int)uVar10);
            }
          }
          goto LAB_0038c767;
        }
        goto LAB_0038cbd3;
      }
LAB_0038c7a9:
      if (0 < (int)uVar1) {
        ppvVar4 = pVVar3->pArray;
        if ((int)uVar26 < 1) {
          uVar9 = 0;
        }
        uVar19 = 0;
LAB_0038c7d6:
        if (uVar19 != uVar9) {
          puVar22 = pVVar2->ppPages[(uint)uVar19 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                    (int)((pVVar2->PageMask & (uint)uVar19) * pVVar2->nEntrySize);
          pvVar5 = ppvVar4[uVar19];
          uVar18 = 0;
          uVar26 = 0;
LAB_0038c82a:
          if ((int)uVar13 < 7) {
            uVar15 = (uint)((s_Truths6Neg[uVar18] &
                            (*puVar22 >> ((byte)(1 << ((byte)uVar18 & 0x1f)) & 0x3f) ^ *puVar22)) !=
                           0);
          }
          else {
            uVar15 = 0;
            if (uVar18 < 6) {
              if (iVar7 != 0x1f) {
                uVar12 = 0;
                do {
                  if (((puVar22[uVar12] >> ((byte)(1 << ((byte)uVar18 & 0x1f)) & 0x3f) ^
                       puVar22[uVar12]) & s_Truths6Neg[uVar18]) != 0) goto LAB_0038c8f6;
                  uVar12 = uVar12 + 1;
                  uVar15 = 0;
                } while (uVar16 != uVar12);
              }
            }
            else if (iVar7 != 0x1f) {
              bVar8 = (byte)(uVar18 - 6);
              uVar15 = 1 << (bVar8 & 0x1f);
              iVar17 = 2 << (bVar8 & 0x1f);
              uVar12 = 1;
              if (1 < (int)uVar15) {
                uVar12 = (ulong)uVar15;
              }
              puVar25 = puVar22 + (int)uVar15;
              puVar23 = puVar22;
              do {
                if (uVar18 - 6 != 0x1f) {
                  uVar21 = 0;
                  do {
                    if (puVar23[uVar21] != puVar25[uVar21]) goto LAB_0038c8f6;
                    uVar21 = uVar21 + 1;
                  } while (uVar12 != uVar21);
                }
                puVar23 = puVar23 + iVar17;
                puVar25 = puVar25 + iVar17;
                uVar15 = 0;
              } while (puVar23 < puVar22 + (int)uVar10);
            }
          }
          goto LAB_0038c903;
        }
LAB_0038cbd3:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
LAB_0038c96b:
      lVar11 = lVar11 + 1;
    } while (lVar11 != uVar14 + 1);
  }
  piVar27 = local_468;
  fwrite(" N :  ",6,1,(FILE *)pFile);
  fwrite(" Total  ",8,1,(FILE *)pFile);
  uVar14 = 0;
  do {
    fprintf((FILE *)pFile,"%6d",uVar14);
    uVar13 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar13;
  } while (uVar13 != 0x11);
  fwrite("  ",2,1,(FILE *)pFile);
  fwrite("  More",6,1,(FILE *)pFile);
  fwrite("     Ave",8,1,(FILE *)pFile);
  fwrite("     Max",8,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  if (-1 < p->nVars) {
    uVar14 = 0;
    do {
      fprintf((FILE *)pFile,"%2d :  ",uVar14 & 0xffffffff);
      uVar13 = local_4a8[uVar14];
      fprintf((FILE *)pFile,"%6d  ",(ulong)uVar13);
      uVar10 = 1;
      if (1 < (int)uVar13) {
        uVar10 = uVar13;
      }
      lVar11 = 0;
      do {
        fprintf((FILE *)pFile,"%6.1f",
                SUB84(((double)piVar27[lVar11] * 100.0) / (double)(int)uVar10,0));
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x11);
      fwrite("  ",2,1,(FILE *)pFile);
      if ((int)uVar13 < 2) {
        uVar13 = 1;
      }
      fprintf((FILE *)pFile,"%6.1f",
              SUB84(((double)aiStack_424[uVar14 * 0x12] * 100.0) / (double)(int)uVar13,0));
      fwrite("  ",2,1,(FILE *)pFile);
      fprintf((FILE *)pFile,"%6.1f",SUB84((double)local_4e8[uVar14] / (double)(int)uVar13,0));
      fwrite("  ",2,1,(FILE *)pFile);
      fprintf((FILE *)pFile,"%6d",(ulong)local_528[uVar14]);
      fputc(10,(FILE *)pFile);
      piVar27 = piVar27 + 0x12;
      bVar6 = (long)uVar14 < (long)p->nVars;
      uVar14 = uVar14 + 1;
    } while (bVar6);
  }
  return;
LAB_0038c753:
  uVar15 = 1;
LAB_0038c767:
  uVar21 = (ulong)((int)uVar21 + uVar15);
  uVar12 = uVar12 + 1;
  if (uVar12 == uVar14) goto code_r0x0038c776;
  goto LAB_0038c681;
code_r0x0038c776:
  uVar15 = *(uint *)((long)ppvVar4[uVar18] + 4);
  if ((int)uVar15 < (int)local_528[uVar21]) {
    uVar15 = local_528[uVar21];
  }
  local_528[uVar21] = uVar15;
  uVar18 = uVar18 + 1;
  if (uVar18 == uVar1) goto LAB_0038c7a9;
  goto LAB_0038c626;
LAB_0038c8f6:
  uVar15 = 1;
LAB_0038c903:
  uVar26 = uVar26 + uVar15;
  uVar18 = uVar18 + 1;
  if (uVar18 == uVar14) goto code_r0x0038c912;
  goto LAB_0038c82a;
code_r0x0038c912:
  uVar18 = (ulong)uVar26;
  local_4a8[uVar18] = local_4a8[uVar18] + 1;
  iVar17 = *(int *)((long)pvVar5 + 4);
  local_4e8[uVar18] = local_4e8[uVar18] + iVar17;
  if (0x10 < iVar17) {
    iVar17 = 0x11;
  }
  local_468[uVar18 * 0x12 + (long)iVar17] = local_468[uVar18 * 0x12 + (long)iVar17] + 1;
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar1) goto LAB_0038c96b;
  goto LAB_0038c7d6;
}

Assistant:

void If_DsdManPrintDecs( FILE * pFile, If_DsdMan_t * p )
{
    Vec_Int_t * vDecs;
    int i, k, v, nSuppSize, nDecMax = 0;
    int pDecMax[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCountsAll[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCountsSSizes[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCounts[IF_MAX_FUNC_LUTSIZE][DSD_ARRAY_LIMIT+2] = {{0}};
    word * pTruth;
    for ( v = 3; v <= p->nVars; v++ )
    {
        assert( Vec_MemEntryNum(p->vTtMem[v]) == Vec_PtrSize(p->vTtDecs[v]) );
        // find max number of decompositions
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vDecs, i )
        {
            pTruth = Vec_MemReadEntry( p->vTtMem[v], i );
            nSuppSize = Abc_TtSupportSize( pTruth, p->nVars );
            pDecMax[nSuppSize] = Abc_MaxInt( pDecMax[nSuppSize], Vec_IntSize(vDecs) );
            nDecMax = Abc_MaxInt( nDecMax, Vec_IntSize(vDecs) );
        }
        // fill up
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vDecs, i )
        {
            pTruth = Vec_MemReadEntry( p->vTtMem[v], i );
            nSuppSize = Abc_TtSupportSize( pTruth, p->nVars );
            pCountsAll[nSuppSize]++;
            pCountsSSizes[nSuppSize] += Vec_IntSize(vDecs);
            pCounts[nSuppSize][Abc_MinInt(DSD_ARRAY_LIMIT+1,Vec_IntSize(vDecs))]++;
    //        pCounts[nSuppSize][Abc_MinInt(DSD_ARRAY_LIMIT+1,Vec_IntSize(vDecs)?1+(Vec_IntSize(vDecs)/10):0)]++;
    /*
            if ( nSuppSize == 6 && Vec_IntSize(vDecs) == pDecMax[6] )
            {
                fprintf( pFile, "0x" );
                Abc_TtPrintHex( pTruth, nSuppSize );
                Dau_DecPrintSets( vDecs, nSuppSize );
            }
    */
        }
    }
    // print header
    fprintf( pFile, " N :  " );
    fprintf( pFile, " Total  " );
    for ( k = 0; k <= DSD_ARRAY_LIMIT; k++ )
        fprintf( pFile, "%6d", k );
    fprintf( pFile, "  " );
    fprintf( pFile, "  More" );
    fprintf( pFile, "     Ave" );
    fprintf( pFile, "     Max" );
    fprintf( pFile, "\n" );
    // print rows
    for ( i = 0; i <= p->nVars; i++ )
    {
        fprintf( pFile, "%2d :  ", i );
        fprintf( pFile, "%6d  ", pCountsAll[i] );
        for ( k = 0; k <= DSD_ARRAY_LIMIT; k++ )
//            fprintf( pFile, "%6d", pCounts[i][k] );
            fprintf( pFile, "%6.1f", 100.0*pCounts[i][k]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
//        fprintf( pFile, "%6d", pCounts[i][k] );
        fprintf( pFile, "%6.1f", 100.0*pCounts[i][k]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
        fprintf( pFile, "%6.1f", 1.0*pCountsSSizes[i]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
        fprintf( pFile, "%6d", pDecMax[i] );
        fprintf( pFile, "\n" );
    }
}